

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int name_locate(int argc,char **argv)

{
  zip_flags_t zVar1;
  long lVar2;
  
  zVar1 = get_flags(argv[1]);
  lVar2 = zip_name_locate(za,*argv,zVar1);
  if (lVar2 < 0) {
    fprintf(_stderr,"can\'t find entry with name \'%s\' using flags \'%s\'\n",*argv,argv[1]);
  }
  else {
    printf("name \'%s\' using flags \'%s\' found at index %ld\n",*argv,argv[1],lVar2);
  }
  return 0;
}

Assistant:

static int
name_locate(int argc, char *argv[]) {
    zip_flags_t flags;
    zip_int64_t idx;
    flags = get_flags(argv[1]);

    if ((idx = zip_name_locate(za, argv[0], flags)) < 0) {
	fprintf(stderr, "can't find entry with name '%s' using flags '%s'\n", argv[0], argv[1]);
    }
    else {
	printf("name '%s' using flags '%s' found at index %" PRId64 "\n", argv[0], argv[1], idx);
    }

    return 0;
}